

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManTransformDualOutput(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  bool bVar8;
  Vec_Int_t *t;
  int fSwap;
  int i;
  Gia_Obj_t *pObj2;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vNodes1;
  Vec_Int_t *vNodes0;
  Gia_Man_t *p_local;
  
  vNodes1 = Gia_ManCollectOneSide(p,0);
  pGVar4 = (Gia_Man_t *)Gia_ManCollectOneSide(p,1);
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc05,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  uVar2 = Gia_ManPoNum(p);
  if ((uVar2 & 1) == 0) {
    iVar1 = Vec_IntSize(vNodes1);
    iVar3 = Vec_IntSize((Vec_Int_t *)pGVar4);
    pNew = pGVar4;
    if (iVar3 < iVar1) {
      pNew = (Gia_Man_t *)vNodes1;
      vNodes1 = (Vec_Int_t *)pGVar4;
    }
    t._0_4_ = (uint)(iVar3 < iVar1);
    iVar1 = Vec_IntSize(vNodes1);
    iVar3 = Vec_IntSize((Vec_Int_t *)pNew);
    if (iVar1 <= iVar3) {
      iVar1 = Gia_ManObjNum(p);
      pGVar4 = Gia_ManStart(iVar1);
      pcVar5 = Abc_UtilStrsav(p->pName);
      pGVar4->pName = pcVar5;
      pcVar5 = Abc_UtilStrsav(p->pSpec);
      pGVar4->pSpec = pcVar5;
      pGVar6 = Gia_ManConst0(p);
      pGVar6->Value = 0;
      Gia_ManHashAlloc(pGVar4);
      t._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar8 = false;
        if ((int)t._4_4_ < iVar1) {
          pObj2 = Gia_ManCi(p,t._4_4_);
          bVar8 = pObj2 != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        uVar2 = Gia_ManAppendCi(pGVar4);
        pObj2->Value = uVar2;
        t._4_4_ = t._4_4_ + 1;
      }
      t._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(vNodes1);
        bVar8 = false;
        if ((int)t._4_4_ < iVar1) {
          iVar1 = Vec_IntEntry(vNodes1,t._4_4_);
          pObj2 = Gia_ManObj(p,iVar1);
          bVar8 = pObj2 != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        iVar1 = Gia_ObjFanin0Copy(pObj2);
        iVar3 = Gia_ObjFanin1Copy(pObj2);
        uVar2 = Gia_ManHashAnd(pGVar4,iVar1,iVar3);
        pObj2->Value = uVar2;
        t._4_4_ = t._4_4_ + 1;
      }
      t._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize((Vec_Int_t *)pNew);
        bVar8 = false;
        if ((int)t._4_4_ < iVar1) {
          iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,t._4_4_);
          pObj2 = Gia_ManObj(p,iVar1);
          bVar8 = pObj2 != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        iVar1 = Gia_ObjFanin0Copy(pObj2);
        iVar3 = Gia_ObjFanin1Copy(pObj2);
        uVar2 = Gia_ManHashAnd(pGVar4,iVar1,iVar3);
        pObj2->Value = uVar2;
        t._4_4_ = t._4_4_ + 1;
      }
      Vec_IntFree(vNodes1);
      Vec_IntFree((Vec_Int_t *)pNew);
      t._4_4_ = 0;
      while( true ) {
        iVar1 = Gia_ManPoNum(p);
        bVar8 = false;
        if ((int)t._4_4_ < iVar1) {
          pObj2 = Gia_ManCo(p,t._4_4_);
          bVar8 = pObj2 != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        pGVar6 = Gia_ManPo(p,t._4_4_ ^ (uint)t);
        iVar1 = Gia_ObjFanin0Copy(pGVar6);
        uVar2 = Gia_ManAppendCo(pGVar4,iVar1);
        pObj2->Value = uVar2;
        t._4_4_ = t._4_4_ + 1;
      }
      Gia_ManHashStop(pGVar4);
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(pGVar4,iVar1);
      pGVar7 = Gia_ManCleanup(pGVar4);
      Gia_ManStop(pGVar4);
      return pGVar7;
    }
    __assert_fail("Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc0c,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0xc06,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManTransformDualOutput( Gia_Man_t * p )
{
    Vec_Int_t * vNodes0 = Gia_ManCollectOneSide( p, 0 );
    Vec_Int_t * vNodes1 = Gia_ManCollectOneSide( p, 1 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, fSwap = 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    if ( Vec_IntSize(vNodes0) > Vec_IntSize(vNodes1) )
    {
        ABC_SWAP( Vec_Int_t *, vNodes0, vNodes1 );
        fSwap = 1;
    }
    assert( Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vNodes0, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachObjVec( vNodes1, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Vec_IntFree( vNodes0 );
    Vec_IntFree( vNodes1 );
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj2 = Gia_ManPo( p, i^fSwap );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj2) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}